

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O1

void uv__io_poll(uv_loop_t *loop,int timeout)

{
  void **ppvVar1;
  int iVar2;
  ulong uVar3;
  uint64_t uVar4;
  uv__io_s *puVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int *piVar10;
  byte *pbVar11;
  uint64_t uVar12;
  uint uVar13;
  long *plVar14;
  uv__io_t *events_00;
  ulong uVar15;
  bool bVar16;
  uv__epoll_event e;
  sigset_t sigset;
  uv__epoll_event events [1024];
  int local_30f0;
  int local_30e8;
  int local_30e4;
  uint64_t local_30d8;
  uv__epoll_event local_30c4;
  sigset_t local_30b8;
  uv__io_t local_3038 [219];
  
  ppvVar1 = loop->watcher_queue;
  plVar14 = (long *)loop->watcher_queue[0];
  if (loop->nfds == 0) {
    if (ppvVar1 == (void **)plVar14) {
      return;
    }
    __assert_fail("QUEUE_EMPTY(&loop->watcher_queue)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                  ,0xda,"void uv__io_poll(uv_loop_t *, int)");
  }
  if (ppvVar1 != (void **)plVar14) {
    do {
      *(long *)plVar14[1] = *plVar14;
      *(long *)(*plVar14 + 8) = plVar14[1];
      *plVar14 = (long)plVar14;
      plVar14[1] = (long)plVar14;
      if (*(uint32_t *)(plVar14 + 2) == 0) {
        __assert_fail("w->pevents != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0xe4,"void uv__io_poll(uv_loop_t *, int)");
      }
      iVar7 = (int)plVar14[3];
      if ((long)iVar7 < 0) {
        __assert_fail("w->fd >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0xe5,"void uv__io_poll(uv_loop_t *, int)");
      }
      if ((int)loop->nwatchers <= iVar7) {
        __assert_fail("w->fd < (int) loop->nwatchers",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0xe6,"void uv__io_poll(uv_loop_t *, int)");
      }
      iVar2 = *(int *)((long)plVar14 + 0x14);
      local_30c4.events = *(uint32_t *)(plVar14 + 2);
      local_30c4.data = (long)iVar7;
      iVar7 = uv__epoll_ctl(loop->backend_fd,(uint)(iVar2 != 0) * 2 + 1,iVar7,&local_30c4);
      if (iVar7 != 0) {
        piVar10 = __errno_location();
        if (*piVar10 != 0x11) goto LAB_005a8640;
        if (iVar2 != 0) {
          __assert_fail("op == UV__EPOLL_CTL_ADD",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0xf7,"void uv__io_poll(uv_loop_t *, int)");
        }
        iVar7 = uv__epoll_ctl(loop->backend_fd,3,(int)plVar14[3],&local_30c4);
        if (iVar7 != 0) goto LAB_005a8640;
      }
      *(int *)((long)plVar14 + 0x14) = (int)plVar14[2];
      plVar14 = (long *)*ppvVar1;
    } while (ppvVar1 != (void **)plVar14);
  }
  uVar3 = loop->flags;
  if ((uVar3 & 1) == 0) {
    local_30d8 = 0;
  }
  else {
    sigemptyset(&local_30b8);
    sigaddset(&local_30b8,0x1b);
    local_30d8 = 0x4000000;
  }
  if (timeout < -1) {
    __assert_fail("timeout >= -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                  ,0x108,"void uv__io_poll(uv_loop_t *, int)");
  }
  uVar4 = loop->time;
  local_30e4 = 0x30;
  local_30f0 = timeout;
  while ((((uVar3 & 1) == 0 || ((uv__io_poll_no_epoll_pwait & 1) == 0)) ||
         (iVar7 = pthread_sigmask(0,&local_30b8,(__sigset_t *)0x0), iVar7 == 0))) {
    if ((uv__io_poll_no_epoll_wait == '\0') &&
       ((uv__io_poll_no_epoll_pwait & 1) != 0 || (uVar3 & 1) == 0)) {
      uVar8 = uv__epoll_wait(loop->backend_fd,(uv__epoll_event *)local_3038,0x400,timeout);
      if (uVar8 == 0xffffffff) {
        piVar10 = __errno_location();
        iVar7 = *piVar10;
        pbVar11 = (byte *)&uv__io_poll_no_epoll_wait;
joined_r0x005a83e6:
        uVar8 = 0xffffffff;
        if (iVar7 == 0x26) {
          uVar8 = 0xffffffff;
          *pbVar11 = 1;
        }
      }
    }
    else {
      uVar8 = uv__epoll_pwait(loop->backend_fd,(uv__epoll_event *)local_3038,0x400,timeout,
                              local_30d8);
      if (uVar8 == 0xffffffff) {
        piVar10 = __errno_location();
        iVar7 = *piVar10;
        pbVar11 = &uv__io_poll_no_epoll_pwait;
        goto joined_r0x005a83e6;
      }
    }
    if ((((uVar3 & 1) != 0) && ((uv__io_poll_no_epoll_pwait & 1) != 0)) &&
       (iVar7 = pthread_sigmask(1,&local_30b8,(__sigset_t *)0x0), iVar7 != 0)) break;
    piVar10 = __errno_location();
    iVar7 = *piVar10;
    uVar12 = uv__hrtime(UV_CLOCK_FAST);
    loop->time = uVar12 / 1000000;
    *piVar10 = iVar7;
    if (uVar8 == 0xffffffff) {
      if (iVar7 == 0x26) {
        if ((uv__io_poll_no_epoll_wait == '\x01') && ((uv__io_poll_no_epoll_pwait & 1) != 0)) {
          __assert_fail("no_epoll_wait == 0 || no_epoll_pwait == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0x142,"void uv__io_poll(uv_loop_t *, int)");
        }
      }
      else {
        if (iVar7 != 4) break;
LAB_005a85a4:
        if (timeout != -1) {
          if (timeout == 0) {
            return;
          }
LAB_005a85c4:
          if (timeout < 1) {
            __assert_fail("timeout > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                          ,0x1af,"void uv__io_poll(uv_loop_t *, int)");
          }
          local_30f0 = local_30f0 + ((int)uVar4 - (int)loop->time);
          timeout = local_30f0;
          if (local_30f0 < 1) {
            return;
          }
        }
      }
    }
    else {
      if (uVar8 == 0) {
        if (timeout == 0) {
          return;
        }
        if (timeout == -1) {
          __assert_fail("timeout != -1",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0x134,"void uv__io_poll(uv_loop_t *, int)");
        }
        goto LAB_005a85c4;
      }
      if (loop->watchers == (uv__io_t **)0x0) {
        __assert_fail("loop->watchers != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0x156,"void uv__io_poll(uv_loop_t *, int)");
      }
      uVar13 = loop->nwatchers;
      loop->watchers[uVar13] = local_3038;
      loop->watchers[uVar13 + 1] = (uv__io_t *)(long)(int)uVar8;
      if ((int)uVar8 < 1) {
        bVar6 = true;
        bVar16 = true;
      }
      else {
        uVar15 = (ulong)uVar8;
        local_30e8 = 0;
        bVar6 = false;
        events_00 = local_3038;
        do {
          uVar13 = (uint)*(undefined8 *)((long)&events_00->cb + 4);
          if (uVar13 != 0xffffffff) {
            if ((int)uVar13 < 0) {
              __assert_fail("fd >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                            ,0x161,"void uv__io_poll(uv_loop_t *, int)");
            }
            if (loop->nwatchers <= uVar13) {
              __assert_fail("(unsigned) fd < loop->nwatchers",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                            ,0x162,"void uv__io_poll(uv_loop_t *, int)");
            }
            puVar5 = loop->watchers[uVar13 & 0x7fffffff];
            if (puVar5 == (uv__io_s *)0x0) {
              uv__epoll_ctl(loop->backend_fd,2,uVar13,(uv__epoll_event *)events_00);
            }
            else {
              uVar13 = puVar5->pevents;
              uVar9 = (uVar13 | 0x18) & *(uint *)&events_00->cb;
              *(uint *)&events_00->cb = uVar9;
              if ((uVar9 == 0x10) || (uVar9 == 8)) {
                *(uint *)&events_00->cb = uVar9 | uVar13 & 5;
              }
              if (*(uint *)&events_00->cb != 0) {
                if (puVar5 == &loop->signal_io_watcher) {
                  bVar6 = true;
                }
                else {
                  (*puVar5->cb)(loop,puVar5,*(uint *)&events_00->cb);
                }
                local_30e8 = local_30e8 + 1;
              }
            }
          }
          events_00 = (uv__io_t *)((long)events_00->pending_queue + 4);
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
        bVar6 = !bVar6;
        bVar16 = local_30e8 == 0;
      }
      if (!bVar6) {
        (*(loop->signal_io_watcher).cb)(loop,&loop->signal_io_watcher,1);
        uVar8 = loop->nwatchers;
        loop->watchers[uVar8] = (uv__io_t *)0x0;
        loop->watchers[uVar8 + 1] = (uv__io_t *)0x0;
        return;
      }
      uVar13 = loop->nwatchers;
      loop->watchers[uVar13] = (uv__io_t *)0x0;
      loop->watchers[uVar13 + 1] = (uv__io_t *)0x0;
      if (bVar16) goto LAB_005a85a4;
      if (uVar8 != 0x400) {
        return;
      }
      timeout = 0;
      local_30e4 = local_30e4 + -1;
      if (local_30e4 == 0) {
        return;
      }
    }
  }
LAB_005a8640:
  abort();
}

Assistant:

void uv__io_poll(uv_loop_t* loop, int timeout) {
  /* A bug in kernels < 2.6.37 makes timeouts larger than ~30 minutes
   * effectively infinite on 32 bits architectures.  To avoid blocking
   * indefinitely, we cap the timeout and poll again if necessary.
   *
   * Note that "30 minutes" is a simplification because it depends on
   * the value of CONFIG_HZ.  The magic constant assumes CONFIG_HZ=1200,
   * that being the largest value I have seen in the wild (and only once.)
   */
  static const int max_safe_timeout = 1789569;
  static int no_epoll_pwait;
  static int no_epoll_wait;
  struct uv__epoll_event events[1024];
  struct uv__epoll_event* pe;
  struct uv__epoll_event e;
  int real_timeout;
  QUEUE* q;
  uv__io_t* w;
  sigset_t sigset;
  uint64_t sigmask;
  uint64_t base;
  int have_signals;
  int nevents;
  int count;
  int nfds;
  int fd;
  int op;
  int i;

  if (loop->nfds == 0) {
    assert(QUEUE_EMPTY(&loop->watcher_queue));
    return;
  }

  while (!QUEUE_EMPTY(&loop->watcher_queue)) {
    q = QUEUE_HEAD(&loop->watcher_queue);
    QUEUE_REMOVE(q);
    QUEUE_INIT(q);

    w = QUEUE_DATA(q, uv__io_t, watcher_queue);
    assert(w->pevents != 0);
    assert(w->fd >= 0);
    assert(w->fd < (int) loop->nwatchers);

    e.events = w->pevents;
    e.data = w->fd;

    if (w->events == 0)
      op = UV__EPOLL_CTL_ADD;
    else
      op = UV__EPOLL_CTL_MOD;

    /* XXX Future optimization: do EPOLL_CTL_MOD lazily if we stop watching
     * events, skip the syscall and squelch the events after epoll_wait().
     */
    if (uv__epoll_ctl(loop->backend_fd, op, w->fd, &e)) {
      if (errno != EEXIST)
        abort();

      assert(op == UV__EPOLL_CTL_ADD);

      /* We've reactivated a file descriptor that's been watched before. */
      if (uv__epoll_ctl(loop->backend_fd, UV__EPOLL_CTL_MOD, w->fd, &e))
        abort();
    }

    w->events = w->pevents;
  }

  sigmask = 0;
  if (loop->flags & UV_LOOP_BLOCK_SIGPROF) {
    sigemptyset(&sigset);
    sigaddset(&sigset, SIGPROF);
    sigmask |= 1 << (SIGPROF - 1);
  }

  assert(timeout >= -1);
  base = loop->time;
  count = 48; /* Benchmarks suggest this gives the best throughput. */
  real_timeout = timeout;

  for (;;) {
    /* See the comment for max_safe_timeout for an explanation of why
     * this is necessary.  Executive summary: kernel bug workaround.
     */
    if (sizeof(int32_t) == sizeof(long) && timeout >= max_safe_timeout)
      timeout = max_safe_timeout;

    if (sigmask != 0 && no_epoll_pwait != 0)
      if (pthread_sigmask(SIG_BLOCK, &sigset, NULL))
        abort();

    if (no_epoll_wait != 0 || (sigmask != 0 && no_epoll_pwait == 0)) {
      nfds = uv__epoll_pwait(loop->backend_fd,
                             events,
                             ARRAY_SIZE(events),
                             timeout,
                             sigmask);
      if (nfds == -1 && errno == ENOSYS)
        no_epoll_pwait = 1;
    } else {
      nfds = uv__epoll_wait(loop->backend_fd,
                            events,
                            ARRAY_SIZE(events),
                            timeout);
      if (nfds == -1 && errno == ENOSYS)
        no_epoll_wait = 1;
    }

    if (sigmask != 0 && no_epoll_pwait != 0)
      if (pthread_sigmask(SIG_UNBLOCK, &sigset, NULL))
        abort();

    /* Update loop->time unconditionally. It's tempting to skip the update when
     * timeout == 0 (i.e. non-blocking poll) but there is no guarantee that the
     * operating system didn't reschedule our process while in the syscall.
     */
    SAVE_ERRNO(uv__update_time(loop));

    if (nfds == 0) {
      assert(timeout != -1);

      if (timeout == 0)
        return;

      /* We may have been inside the system call for longer than |timeout|
       * milliseconds so we need to update the timestamp to avoid drift.
       */
      goto update_timeout;
    }

    if (nfds == -1) {
      if (errno == ENOSYS) {
        /* epoll_wait() or epoll_pwait() failed, try the other system call. */
        assert(no_epoll_wait == 0 || no_epoll_pwait == 0);
        continue;
      }

      if (errno != EINTR)
        abort();

      if (timeout == -1)
        continue;

      if (timeout == 0)
        return;

      /* Interrupted by a signal. Update timeout and poll again. */
      goto update_timeout;
    }

    have_signals = 0;
    nevents = 0;

    assert(loop->watchers != NULL);
    loop->watchers[loop->nwatchers] = (void*) events;
    loop->watchers[loop->nwatchers + 1] = (void*) (uintptr_t) nfds;
    for (i = 0; i < nfds; i++) {
      pe = events + i;
      fd = pe->data;

      /* Skip invalidated events, see uv__platform_invalidate_fd */
      if (fd == -1)
        continue;

      assert(fd >= 0);
      assert((unsigned) fd < loop->nwatchers);

      w = loop->watchers[fd];

      if (w == NULL) {
        /* File descriptor that we've stopped watching, disarm it.
         *
         * Ignore all errors because we may be racing with another thread
         * when the file descriptor is closed.
         */
        uv__epoll_ctl(loop->backend_fd, UV__EPOLL_CTL_DEL, fd, pe);
        continue;
      }

      /* Give users only events they're interested in. Prevents spurious
       * callbacks when previous callback invocation in this loop has stopped
       * the current watcher. Also, filters out events that users has not
       * requested us to watch.
       */
      pe->events &= w->pevents | POLLERR | POLLHUP;

      /* Work around an epoll quirk where it sometimes reports just the
       * EPOLLERR or EPOLLHUP event.  In order to force the event loop to
       * move forward, we merge in the read/write events that the watcher
       * is interested in; uv__read() and uv__write() will then deal with
       * the error or hangup in the usual fashion.
       *
       * Note to self: happens when epoll reports EPOLLIN|EPOLLHUP, the user
       * reads the available data, calls uv_read_stop(), then sometime later
       * calls uv_read_start() again.  By then, libuv has forgotten about the
       * hangup and the kernel won't report EPOLLIN again because there's
       * nothing left to read.  If anything, libuv is to blame here.  The
       * current hack is just a quick bandaid; to properly fix it, libuv
       * needs to remember the error/hangup event.  We should get that for
       * free when we switch over to edge-triggered I/O.
       */
      if (pe->events == POLLERR || pe->events == POLLHUP)
        pe->events |= w->pevents & (POLLIN | POLLOUT);

      if (pe->events != 0) {
        /* Run signal watchers last.  This also affects child process watchers
         * because those are implemented in terms of signal watchers.
         */
        if (w == &loop->signal_io_watcher)
          have_signals = 1;
        else
          w->cb(loop, w, pe->events);

        nevents++;
      }
    }

    if (have_signals != 0)
      loop->signal_io_watcher.cb(loop, &loop->signal_io_watcher, POLLIN);

    loop->watchers[loop->nwatchers] = NULL;
    loop->watchers[loop->nwatchers + 1] = NULL;

    if (have_signals != 0)
      return;  /* Event loop should cycle now so don't poll again. */

    if (nevents != 0) {
      if (nfds == ARRAY_SIZE(events) && --count != 0) {
        /* Poll for more events but don't block this time. */
        timeout = 0;
        continue;
      }
      return;
    }

    if (timeout == 0)
      return;

    if (timeout == -1)
      continue;

update_timeout:
    assert(timeout > 0);

    real_timeout -= (loop->time - base);
    if (real_timeout <= 0)
      return;

    timeout = real_timeout;
  }
}